

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O3

void * invoke_writer_ops(void *args)

{
  FileHandlePool *pFVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  ts_nsec tVar4;
  size_t sVar5;
  size_t sVar6;
  ts_nsec tVar7;
  uint64_t uVar8;
  long lVar9;
  int iVar10;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char bodybuf [256];
  char keybuf [256];
  fdb_kvs_handle *local_260;
  fdb_file_handle *local_258;
  int local_24c;
  undefined8 *local_248;
  long local_240;
  char local_238 [256];
  char local_138 [264];
  
  local_240 = std::chrono::_V2::system_clock::now();
  iVar3 = 0;
  local_248 = (undefined8 *)args;
  do {
    local_258 = (fdb_file_handle *)0x0;
    local_260 = (fdb_kvs_handle *)0x0;
    local_24c = FileHandlePool::getAvailableResource(*args,&local_258,&local_260);
    fVar2 = fdb_begin_transaction(local_258,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x169,(long)fVar2,0);
    }
    iVar10 = 0;
    do {
      sprintf(local_138,"key%d",(ulong)(uint)(iVar3 + iVar10));
      sprintf(local_238,"body%d",(ulong)(uint)(iVar3 + iVar10));
      tVar4 = get_monotonic_ts();
      handle = local_260;
      sVar5 = strlen(local_138);
      sVar6 = strlen(local_238);
      fVar2 = fdb_set_kv(handle,local_138,sVar5 + 1,local_238,sVar6 + 1);
      tVar7 = get_monotonic_ts();
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fdb_assert_die("status == FDB_RESULT_SUCCESS",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                       ,0x176,(long)fVar2,0);
      }
      pFVar1 = (FileHandlePool *)*local_248;
      uVar8 = ts_diff(tVar4,tVar7);
      FileHandlePool::collectStat(pFVar1,0,uVar8);
      iVar10 = iVar10 + 1;
    } while (iVar10 != 9);
    tVar4 = get_monotonic_ts();
    fVar2 = fdb_end_transaction(local_258,'\0');
    tVar7 = get_monotonic_ts();
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x17f,(long)fVar2,0);
    }
    args = local_248;
    pFVar1 = (FileHandlePool *)*local_248;
    uVar8 = ts_diff(tVar4,tVar7);
    FileHandlePool::collectStat(pFVar1,1,uVar8);
    iVar10 = local_24c;
    if (*(char *)((long)args + 0xc) == '\x01') {
      SnapHandlePool::addNewSnapHandle(*args,local_24c,local_260);
    }
    iVar3 = iVar3 + 9;
    FileHandlePool::returnResourceToPool(*args,iVar10);
    lVar9 = std::chrono::_V2::system_clock::now();
  } while ((double)(lVar9 - local_240) / 1000000000.0 <= (double)*(float *)((long)args + 8));
  pthread_exit((void *)0x0);
}

Assistant:

static void *invoke_writer_ops(void *args) {
    struct ops_args *oa = static_cast<ops_args *>(args);
    int i = 0, j;
    fdb_status status;
    std::chrono::time_point<std::chrono::system_clock> start, end;
    start = std::chrono::system_clock::now();

    while (true) {
        // Acquire handles from pool
        fdb_file_handle *dbfile = nullptr;
        fdb_kvs_handle *db = nullptr;
        const int index = oa->hp->getAvailableResource(&dbfile, &db);

        char keybuf[256], bodybuf[256];

        // Start transaction
        status = fdb_begin_transaction(dbfile, FDB_ISOLATION_READ_COMMITTED);
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        // Issue a batch of 10 sets
        j = 10;
        while (--j != 0) {
            sprintf(keybuf, "key%d", i);
            sprintf(bodybuf, "body%d", i);

            ts_nsec beginSet = get_monotonic_ts();
            status = fdb_set_kv(db,
                                (void*)keybuf, strlen(keybuf) + 1,
                                (void*)bodybuf, strlen(bodybuf) + 1);
            ts_nsec endSet = get_monotonic_ts();
            fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
            oa->hp->collectStat(SET, ts_diff(beginSet, endSet));
            ++i;
        }

        // End transaction (Commit)
        ts_nsec beginCommit = get_monotonic_ts();
        status = fdb_end_transaction(dbfile, FDB_COMMIT_NORMAL);
        ts_nsec endCommit = get_monotonic_ts();
        fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

        oa->hp->collectStat(COMMIT, ts_diff(beginCommit, endCommit));

        // Create a snapshot handle if snap handle pool is in use
        if (oa->snapPoolAvailable) {
            (static_cast<SnapHandlePool*>(oa->hp))->addNewSnapHandle(index, db);
        }

        // Return resource to pool
        oa->hp->returnResourceToPool(index);

        end = std::chrono::system_clock::now();
        std::chrono::duration<double> elapsed_seconds = end - start;
        if (elapsed_seconds.count() > oa->time) {
#ifdef __DEBUG_USECASE
            fprintf(stderr, "Writer: Ends after %fs\n", elapsed_seconds.count());
#endif
            break;
        }
    }
    thread_exit(0);
    return nullptr;
}